

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int ns_avprintf(char **buf,size_t size,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  char *pcVar2;
  va_list ap_copy;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  local_38 = ap->reg_save_area;
  local_48._0_4_ = ap->gp_offset;
  local_48._4_4_ = ap->fp_offset;
  pvStack_40 = ap->overflow_arg_area;
  iVar1 = vsnprintf(*buf,size,fmt,&local_48);
  if (iVar1 < 0) {
    *buf = (char *)0x0;
    do {
      if (*buf != (char *)0x0) {
        free(*buf);
      }
      size = size * 2;
      pcVar2 = (char *)malloc(size);
      *buf = pcVar2;
      if (pcVar2 == (char *)0x0) {
        return iVar1;
      }
      local_38 = ap->reg_save_area;
      local_48._0_4_ = ap->gp_offset;
      local_48._4_4_ = ap->fp_offset;
      pvStack_40 = ap->overflow_arg_area;
      iVar1 = vsnprintf(*buf,size,fmt,&local_48);
    } while (iVar1 < 0);
  }
  else if ((int)size < iVar1) {
    pcVar2 = (char *)malloc((ulong)(iVar1 + 1));
    *buf = pcVar2;
    if (pcVar2 == (char *)0x0) {
      iVar1 = -1;
    }
    else {
      local_38 = ap->reg_save_area;
      local_48._0_4_ = ap->gp_offset;
      local_48._4_4_ = ap->fp_offset;
      pvStack_40 = ap->overflow_arg_area;
      iVar1 = vsnprintf(*buf,(ulong)(iVar1 + 1),fmt,&local_48);
    }
  }
  return iVar1;
}

Assistant:

int ns_avprintf(char **buf, size_t size, const char *fmt, va_list ap) {
  va_list ap_copy;
  int len;

  va_copy(ap_copy, ap);
  len = vsnprintf(*buf, size, fmt, ap_copy);
  va_end(ap_copy);

  if (len < 0) {
    // eCos and Windows are not standard-compliant and return -1 when
    // the buffer is too small. Keep allocating larger buffers until we
    // succeed or out of memory.
    *buf = NULL;
    while (len < 0) {
      if (*buf) free(*buf);
      size *= 2;
      if ((*buf = (char *) NS_MALLOC(size)) == NULL) break;
      va_copy(ap_copy, ap);
      len = vsnprintf(*buf, size, fmt, ap_copy);
      va_end(ap_copy);
    }
  } else if (len > (int) size) {
    // Standard-compliant code path. Allocate a buffer that is large enough.
    if ((*buf = (char *) NS_MALLOC(len + 1)) == NULL) {
      len = -1;
    } else {
      va_copy(ap_copy, ap);
      len = vsnprintf(*buf, len + 1, fmt, ap_copy);
      va_end(ap_copy);
    }
  }

  return len;
}